

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tile.cpp
# Opt level: O0

void __thiscall
Tile::Tile(Tile *this,Board *boardPtr,Vector2u *position,bool noAdjacentUpdates,bool suppressUpdate)

{
  byte in_CL;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  byte in_R8B;
  
  *in_RDI = (long)&PTR__Tile_002bbd50;
  sf::Vector2<unsigned_int>::Vector2((Vector2<unsigned_int> *)(in_RDI + 3));
  in_RDI[2] = in_RSI;
  in_RDI[3] = *in_RDX;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined1 *)(in_RDI + 4) = 0;
  if ((in_R8B & 1) == 0) {
    (**(code **)(*in_RDI + 0x40))(in_RDI,0,in_CL & 1);
  }
  return;
}

Assistant:

Tile::Tile(Board* boardPtr, const Vector2u& position, bool noAdjacentUpdates, bool suppressUpdate) {
    _boardPtr = boardPtr;
    _position = position;
    _direction = NORTH;
    _highlight = false;
    if (!suppressUpdate) {
        addUpdate(false, noAdjacentUpdates);
    }
}